

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cc
# Opt level: O0

int BIO_printf(BIO *bio,char *format,...)

{
  bool bVar1;
  uint uVar2;
  size_t requested_len;
  uint local_148;
  int ret;
  int out_len;
  char out_malloced;
  char *out;
  char buf [256];
  va_list args;
  char *format_local;
  BIO *bio_local;
  
  bVar1 = false;
  buf[0xfc] = '0';
  buf[0xfd] = '\0';
  buf[0xfe] = '\0';
  buf[0xff] = '\0';
  buf[0xf8] = '\x10';
  buf[0xf9] = '\0';
  buf[0xfa] = '\0';
  buf[0xfb] = '\0';
  uVar2 = vsnprintf((char *)&out,0x100,format,buf + 0xf8);
  if ((int)uVar2 < 0) {
    bio_local._4_4_ = -1;
  }
  else {
    if (uVar2 < 0x100) {
      _out_len = &out;
      local_148 = uVar2;
    }
    else {
      _out_len = (char **)OPENSSL_malloc((long)(int)uVar2 + 1);
      bVar1 = true;
      if (_out_len == (char **)0x0) {
        return -1;
      }
      buf[0xfc] = '0';
      buf[0xfd] = '\0';
      buf[0xfe] = '\0';
      buf[0xff] = '\0';
      buf[0xf8] = '\x10';
      buf[0xf9] = '\0';
      buf[0xfa] = '\0';
      buf[0xfb] = '\0';
      local_148 = vsnprintf((char *)_out_len,(long)(int)uVar2 + 1,format,buf + 0xf8);
      if (local_148 != uVar2) {
        __assert_fail("out_len == (int)requested_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/printf.cc"
                      ,0x30,"int BIO_printf(BIO *, const char *, ...)");
      }
    }
    bio_local._4_4_ = BIO_write(bio,_out_len,local_148);
    if (bVar1) {
      OPENSSL_free(_out_len);
    }
  }
  return bio_local._4_4_;
}

Assistant:

int BIO_printf(BIO *bio, const char *format, ...) {
  va_list args;
  char buf[256], *out, out_malloced = 0;
  int out_len, ret;

  va_start(args, format);
  out_len = vsnprintf(buf, sizeof(buf), format, args);
  va_end(args);
  if (out_len < 0) {
    return -1;
  }

  if ((size_t)out_len >= sizeof(buf)) {
    const size_t requested_len = (size_t)out_len;
    // The output was truncated. Note that vsnprintf's return value does not
    // include a trailing NUL, but the buffer must be sized for it.
    out = reinterpret_cast<char *>(OPENSSL_malloc(requested_len + 1));
    out_malloced = 1;
    if (out == NULL) {
      return -1;
    }
    va_start(args, format);
    out_len = vsnprintf(out, requested_len + 1, format, args);
    va_end(args);
    assert(out_len == (int)requested_len);
  } else {
    out = buf;
  }

  ret = BIO_write(bio, out, out_len);
  if (out_malloced) {
    OPENSSL_free(out);
  }

  return ret;
}